

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

float duckdb::RoundOperatorPrecision::Operation<float,int,float>(float input,int precision)

{
  uint uVar1;
  int in_EDI;
  float in_XMM0_Da;
  float fVar2;
  __type_conflict1 _Var3;
  double modifier_1;
  double modifier;
  double rounded_value;
  double local_18;
  
  if (in_EDI < 0) {
    _Var3 = std::pow<int,float>(0,2.0602274e-38);
    local_18 = round((double)in_XMM0_Da / _Var3);
    local_18 = local_18 * _Var3;
    uVar1 = std::isinf(local_18);
    if (((uVar1 & 1) != 0) || (uVar1 = std::isnan(local_18), (uVar1 & 1) != 0)) {
      return 0.0;
    }
  }
  else {
    _Var3 = std::pow<int,float>(0,2.0602414e-38);
    local_18 = round((double)in_XMM0_Da * _Var3);
    local_18 = local_18 / _Var3;
    uVar1 = std::isinf(local_18);
    if ((uVar1 & 1) != 0) {
      return in_XMM0_Da;
    }
    uVar1 = std::isnan(local_18);
    if ((uVar1 & 1) != 0) {
      return in_XMM0_Da;
    }
  }
  fVar2 = LossyNumericCast<float,double>(local_18);
  return fVar2;
}

Assistant:

static inline TR Operation(TA input, TB precision) {
		double rounded_value;
		if (precision < 0) {
			double modifier = std::pow(10, -TA(precision));
			rounded_value = (std::round(input / modifier)) * modifier;
			if (std::isinf(rounded_value) || std::isnan(rounded_value)) {
				return 0;
			}
		} else {
			double modifier = std::pow(10, TA(precision));
			rounded_value = (std::round(input * modifier)) / modifier;
			if (std::isinf(rounded_value) || std::isnan(rounded_value)) {
				return input;
			}
		}
		return LossyNumericCast<TR>(rounded_value);
	}